

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O2

void rsg::interpolateVertexInput<64>
               (StridedValueAccess<64> dst,int dstComp,ConstValueRangeAccess valueRange,float x,
               float y)

{
  float x0y0;
  TestError *this;
  uint compNdx;
  uint uVar1;
  float fVar2;
  float y_00;
  ConstStridedValueAccess<1> CVar3;
  StridedValueAccess<64> SVar4;
  ConstStridedValueAccess<1> local_60;
  ConstStridedValueAccess<1> local_50;
  StridedValueAccess<64> dst_local;
  
  dst_local.super_ConstStridedValueAccess<64>.m_value =
       dst.super_ConstStridedValueAccess<64>.m_value;
  dst_local.super_ConstStridedValueAccess<64>.m_type = dst.super_ConstStridedValueAccess<64>.m_type;
  if ((valueRange.m_type)->m_baseType == TYPE_FLOAT) {
    uVar1 = (valueRange.m_type)->m_numElements;
    compNdx = 0;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (; uVar1 != compNdx; compNdx = compNdx + 1) {
      fVar2 = x;
      if ((compNdx & 2) != 0) {
        fVar2 = 1.0 - x;
      }
      y_00 = y;
      if ((compNdx & 1) != 0) {
        y_00 = 1.0 - y;
      }
      local_50.m_type = valueRange.m_type;
      local_50.m_value = valueRange.m_min;
      CVar3 = ConstStridedValueAccess<1>::component(&local_50,compNdx);
      x0y0 = (CVar3.m_value)->floatVal;
      local_60.m_type = valueRange.m_type;
      local_60.m_value = valueRange.m_max;
      CVar3 = ConstStridedValueAccess<1>::component(&local_60,compNdx);
      fVar2 = interpolateVertex(x0y0,(CVar3.m_value)->floatVal,fVar2,y_00);
      SVar4 = StridedValueAccess<64>::component(&dst_local,compNdx);
      SVar4.super_ConstStridedValueAccess<64>.m_value[dstComp].floatVal = fVar2;
    }
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"valueRange.getType().getBaseType() == VariableType::TYPE_FLOAT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
             ,0x8c);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void interpolateVertexInput (StridedValueAccess<Stride> dst, int dstComp, const ConstValueRangeAccess valueRange, float x, float y)
{
	TCU_CHECK(valueRange.getType().getBaseType() == VariableType::TYPE_FLOAT);
	int numElements = valueRange.getType().getNumElements();
	for (int elementNdx = 0; elementNdx < numElements; elementNdx++)
	{
		float xd, yd;
		getVertexInterpolationCoords(xd, yd, x, y, elementNdx);
		dst.component(elementNdx).asFloat(dstComp) = interpolateVertex(valueRange.getMin().component(elementNdx).asFloat(), valueRange.getMax().component(elementNdx).asFloat(), xd, yd);
	}
}